

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

Pattern * __thiscall
trieste::In<trieste::TokenDef,trieste::TokenDef,trieste::TokenDef,trieste::TokenDef>
          (Pattern *__return_storage_ptr__,trieste *this,Token *type1,TokenDef *types,
          TokenDef *types_1,TokenDef *types_2,TokenDef *types_3)

{
  initializer_list<trieste::Token> __l;
  allocator<trieste::Token> local_15e;
  less<trieste::Token> local_15d [13];
  Token local_150;
  Token local_148;
  Token local_140;
  Token local_138;
  Token local_130;
  iterator local_128;
  size_type local_120;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_118;
  FastPattern local_e8;
  undefined1 local_80 [32];
  Token local_60;
  array<trieste::Token,_5UL> types_;
  TokenDef *types_local_3;
  TokenDef *types_local_2;
  TokenDef *types_local_1;
  TokenDef *types_local;
  Token *type1_local;
  
  local_60.def = *(TokenDef **)this;
  types_._M_elems[4].def = types_2;
  Token::Token(types_._M_elems,(TokenDef *)type1);
  Token::Token(types_._M_elems + 1,types);
  Token::Token(types_._M_elems + 2,types_1);
  Token::Token(types_._M_elems + 3,types_._M_elems[4].def);
  std::make_shared<trieste::detail::Inside<5ul>,std::array<trieste::Token,5ul>&>
            ((array<trieste::Token,_5UL> *)local_80);
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr<trieste::detail::Inside<5ul>,void>
            ((shared_ptr<trieste::detail::PatternDef> *)(local_80 + 0x10),
             (shared_ptr<trieste::detail::Inside<5UL>_> *)local_80);
  local_150.def = *(TokenDef **)this;
  Token::Token(&local_148,(TokenDef *)type1);
  Token::Token(&local_140,types);
  Token::Token(&local_138,types_1);
  Token::Token(&local_130,types_._M_elems[4].def);
  local_128 = &local_150;
  local_120 = 5;
  CLI::std::allocator<trieste::Token>::allocator(&local_15e);
  __l._M_len = local_120;
  __l._M_array = local_128;
  std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
            (&local_118,__l,local_15d,&local_15e);
  detail::FastPattern::match_parent(&local_e8,&local_118);
  detail::Pattern::Pattern(__return_storage_ptr__,(PatternPtr *)(local_80 + 0x10),&local_e8);
  detail::FastPattern::~FastPattern(&local_e8);
  CLI::std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
            ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
             &local_118);
  CLI::std::allocator<trieste::Token>::~allocator(&local_15e);
  CLI::std::shared_ptr<trieste::detail::PatternDef>::~shared_ptr
            ((shared_ptr<trieste::detail::PatternDef> *)(local_80 + 0x10));
  std::shared_ptr<trieste::detail::Inside<5UL>_>::~shared_ptr
            ((shared_ptr<trieste::detail::Inside<5UL>_> *)local_80);
  return __return_storage_ptr__;
}

Assistant:

inline detail::Pattern In(const Token& type1, const Ts&... types)
  {
    std::array<Token, 1 + sizeof...(types)> types_ = {type1, types...};
    return detail::Pattern(
      std::make_shared<detail::Inside<1 + sizeof...(types)>>(types_),
      detail::FastPattern::match_parent({type1, types...}));
  }